

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O0

int parse_export_section(wasmbox_input_stream_t *ins,wasm_u64_t section_size,wasmbox_module_t *mod)

{
  int iVar1;
  wasm_u64_t wVar2;
  ulong local_38;
  wasm_u64_t i;
  wasm_u64_t len;
  wasmbox_module_t *mod_local;
  wasm_u64_t section_size_local;
  wasmbox_input_stream_t *ins_local;
  
  wVar2 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
  local_38 = 0;
  while( true ) {
    if (wVar2 <= local_38) {
      return 0;
    }
    iVar1 = parse_export_entry(ins,mod);
    if (iVar1 != 0) break;
    local_38 = local_38 + 1;
  }
  return -1;
}

Assistant:

static int parse_export_section(wasmbox_input_stream_t *ins,
                                wasm_u64_t section_size,
                                wasmbox_module_t *mod) {
  wasm_u64_t len = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                                 &ins->index, ins->length);
  for (wasm_u64_t i = 0; i < len; i++) {
    if (parse_export_entry(ins, mod) != 0) {
      return -1;
    }
  }
  return 0;
}